

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O0

QString * __thiscall ProjectGenerator::getWritableVar(ProjectGenerator *this,char *vk,bool param_3)

{
  bool bVar1;
  QMakeProject *this_00;
  iterator o;
  ProString *this_01;
  ProStringList *this_02;
  qsizetype qVar2;
  long lVar3;
  QString *in_RDI;
  long in_FS_OFFSET;
  int i;
  ProStringList *vals;
  QString spaces;
  QString join;
  QString ret;
  iterator it;
  ProKey v;
  undefined4 in_stack_fffffffffffffd38;
  CaseSensitivity in_stack_fffffffffffffd3c;
  QMakeProject *in_stack_fffffffffffffd40;
  ProString *in_stack_fffffffffffffd48;
  QChar sep;
  ProString *in_stack_fffffffffffffd50;
  QMakeProject *str;
  QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString_&>,_const_char_(&)[2]>
  *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd8c;
  int iVar4;
  QChar local_1ca;
  QString local_1c8;
  QStringBuilder<const_ProKey_&,_const_char_(&)[5]> local_1b0;
  QString local_88;
  QStringBuilder<const_char_(&)[2],_ProString_&> local_70;
  QChar local_44;
  QChar local_42;
  iterator local_40;
  ProString local_38;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_38,0xaa,0x30);
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffd40,
                 (char *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  this_00 = (QMakeProject *)
            QMakeProject::values
                      (in_stack_fffffffffffffd40,
                       (ProKey *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  bVar1 = QList<ProString>::isEmpty((QList<ProString> *)0x1e86d3);
  if (bVar1) {
    QString::QString(&in_stack_fffffffffffffd48->m_string,(char *)in_RDI);
  }
  else {
    local_40.i = (ProString *)0xaaaaaaaaaaaaaaaa;
    local_40 = QList<ProString>::begin((QList<ProString> *)in_stack_fffffffffffffd40);
    while( true ) {
      o = QList<ProString>::end((QList<ProString> *)in_stack_fffffffffffffd40);
      bVar1 = QList<ProString>::iterator::operator!=(&local_40,o);
      if (!bVar1) break;
      QList<ProString>::iterator::operator*(&local_40);
      QChar::QChar<char,_true>(&local_42,' ');
      bVar1 = ProString::contains((ProString *)in_stack_fffffffffffffd40,
                                  (QChar)(char16_t)((ulong)in_stack_fffffffffffffd48 >> 0x30),
                                  in_stack_fffffffffffffd3c);
      if (bVar1) {
        this_01 = QList<ProString>::iterator::operator*(&local_40);
        QChar::QChar<char,_true>(&local_44,' ');
        bVar1 = ProString::startsWith
                          (in_stack_fffffffffffffd50,
                           (QChar)(char16_t)((uint)in_stack_fffffffffffffd8c >> 0x10),
                           (CaseSensitivity)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        if (!bVar1) {
          QList<ProString>::iterator::operator*(&local_40);
          local_70 = ::operator+((char (*) [2])in_stack_fffffffffffffd40,
                                 (ProString *)
                                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          ::operator+((QStringBuilder<const_char_(&)[2],_ProString_&> *)in_stack_fffffffffffffd40,
                      (char (*) [2])CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
          QList<ProString>::iterator::operator*(&local_40);
          ProString::operator=(this_01,in_stack_fffffffffffffd58);
        }
      }
      QList<ProString>::iterator::operator++(&local_40);
    }
    local_88.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_88.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_88.d.size = -0x5555555555555556;
    QString::QString((QString *)0x1e8878);
    bVar1 = ProString::endsWith(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                                (CaseSensitivity)((ulong)in_stack_fffffffffffffd40 >> 0x20));
    if (bVar1) {
      ProString::length(&local_38);
      ProString::left(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      ::operator+(in_stack_fffffffffffffd48,(char (*) [5])in_stack_fffffffffffffd40);
      sep.ucs = (char16_t)((ulong)in_stack_fffffffffffffd48 >> 0x30);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<ProString,_const_char_(&)[5]> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      QString::operator=((QString *)in_stack_fffffffffffffd40,
                         (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      QString::~QString((QString *)0x1e8914);
      QStringBuilder<ProString,_const_char_(&)[5]>::~QStringBuilder
                ((QStringBuilder<ProString,_const_char_(&)[5]> *)0x1e8921);
      ProString::~ProString((ProString *)0x1e892e);
    }
    else {
      bVar1 = ProString::endsWith(in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                                  (CaseSensitivity)((ulong)in_stack_fffffffffffffd40 >> 0x20));
      if (bVar1) {
        ProString::length(&local_38);
        ProString::left(in_stack_fffffffffffffd48,(int)((ulong)in_stack_fffffffffffffd40 >> 0x20));
        ::operator+(in_stack_fffffffffffffd48,(char (*) [4])in_stack_fffffffffffffd40);
        sep.ucs = (char16_t)((ulong)in_stack_fffffffffffffd48 >> 0x30);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<ProString,_const_char_(&)[4]> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        QString::operator=((QString *)in_stack_fffffffffffffd40,
                           (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
        ;
        QString::~QString((QString *)0x1e89cf);
        QStringBuilder<ProString,_const_char_(&)[4]>::~QStringBuilder
                  ((QStringBuilder<ProString,_const_char_(&)[4]> *)0x1e89dc);
        ProString::~ProString((ProString *)0x1e89e9);
      }
      else {
        local_1b0 = ::operator+((ProKey *)in_stack_fffffffffffffd40,
                                (char (*) [5])
                                CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        sep.ucs = (char16_t)((ulong)in_stack_fffffffffffffd48 >> 0x30);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<const_ProKey_&,_const_char_(&)[5]> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
        QString::operator=((QString *)in_stack_fffffffffffffd40,
                           (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
        ;
        QString::~QString((QString *)0x1e8a46);
      }
    }
    local_1c8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_1c8.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_1c8.d.size = -0x5555555555555556;
    str = this_00;
    QChar::QChar<char,_true>(&local_1ca,' ');
    ProStringList::join((ProStringList *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),sep);
    this_02 = (ProStringList *)QString::size(&local_88);
    qVar2 = QString::size(&local_1c8);
    if (0x50 < (long)((long)&(this_02->super_QList<ProString>).d.d + qVar2)) {
      QString::QString((QString *)0x1e8b19);
      iVar4 = 0;
      while( true ) {
        lVar3 = (long)iVar4;
        qVar2 = QString::size(&local_88);
        if (qVar2 <= lVar3) break;
        QString::operator+=((QString *)in_stack_fffffffffffffd40,(char *)this_02);
        iVar4 = iVar4 + 1;
      }
      ::operator+((char (*) [4])this_00,
                  (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      ProStringList::join<char_const(&)[4],QString&>
                (this_02,(QStringBuilder<const_char_(&)[4],_QString_&> *)str);
      QString::operator=((QString *)this_00,
                         (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      QString::~QString((QString *)0x1e8bd0);
      QString::~QString((QString *)0x1e8bdd);
      in_stack_fffffffffffffd40 = this_00;
    }
    ::operator+((QString *)in_stack_fffffffffffffd40,
                (QString *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    ::operator+((QStringBuilder<QString_&,_QString_&> *)in_stack_fffffffffffffd40,
                (char (*) [2])CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QStringBuilder<QString_&,_QString_&>,_const_char_(&)[2]> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    QString::~QString((QString *)0x1e8c45);
    QString::~QString((QString *)0x1e8c52);
  }
  ProKey::~ProKey((ProKey *)0x1e8c5f);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString
ProjectGenerator::getWritableVar(const char *vk, bool)
{
    const ProKey v(vk);
    ProStringList &vals = project->values(v);
    if(vals.isEmpty())
        return "";

    // If values contain spaces, ensure that they are quoted
    for (ProStringList::iterator it = vals.begin(); it != vals.end(); ++it) {
        if ((*it).contains(' ') && !(*it).startsWith(' '))
            *it = "\"" + *it + "\"";
    }

    QString ret;
    if(v.endsWith("_REMOVE"))
        ret = v.left(v.length() - 7) + " -= ";
    else if(v.endsWith("_ASSIGN"))
        ret = v.left(v.length() - 7) + " = ";
    else
        ret = v + " += ";
    QString join = vals.join(' ');
    if(ret.size() + join.size() > 80) {
        QString spaces;
        for(int i = 0; i < ret.size(); i++)
            spaces += " ";
        join = vals.join(" \\\n" + spaces);
    }
    return ret + join + "\n";
}